

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O3

size_t __thiscall
CDBWrapper::EstimateSizeImpl(CDBWrapper *this,Span<const_std::byte> key1,Span<const_std::byte> key2)

{
  DB *pDVar1;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar2;
  long in_FS_OFFSET;
  uint64_t size;
  byte *local_40;
  size_t local_38;
  byte *local_30;
  size_t local_28;
  size_t local_20;
  long local_18;
  
  local_28 = key2.m_size;
  local_30 = key2.m_data;
  local_38 = key1.m_size;
  local_40 = key1.m_data;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0;
  puVar2 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pDVar1 = ((puVar2->_M_t).
            super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
            super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
            super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
  (*pDVar1->_vptr_DB[10])(pDVar1,&local_40,1,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

size_t CDBWrapper::EstimateSizeImpl(Span<const std::byte> key1, Span<const std::byte> key2) const
{
    leveldb::Slice slKey1(CharCast(key1.data()), key1.size());
    leveldb::Slice slKey2(CharCast(key2.data()), key2.size());
    uint64_t size = 0;
    leveldb::Range range(slKey1, slKey2);
    DBContext().pdb->GetApproximateSizes(&range, 1, &size);
    return size;
}